

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::RowOperations::RadixScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t width,idx_t offset)

{
  PhysicalType PVar1;
  NotImplementedException *this;
  UnifiedVectorFormat vdata;
  string local_70;
  string local_50;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(v,vcount,&vdata);
  PVar1 = (v->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      TemplatedRadixScatter<signed_char>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case UINT8:
      TemplatedRadixScatter<unsigned_char>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case UINT16:
      TemplatedRadixScatter<unsigned_short>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case INT16:
      TemplatedRadixScatter<short>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case UINT32:
      TemplatedRadixScatter<unsigned_int>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case INT32:
      TemplatedRadixScatter<int>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case UINT64:
      TemplatedRadixScatter<unsigned_long>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case INT64:
      TemplatedRadixScatter<long>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    default:
switchD_00accf46_caseD_a:
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Cannot ORDER BY column with type %s","");
      LogicalType::ToString_abi_cxx11_(&local_50,&v->type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,&local_70,&local_50);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      TemplatedRadixScatter<float>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case DOUBLE:
      TemplatedRadixScatter<double>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case INTERVAL:
      TemplatedRadixScatter<duckdb::interval_t>
                (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
      break;
    case LIST:
      RadixScatterListVector
                (v,&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,prefix_len,width,
                 offset);
      break;
    case STRUCT:
      RadixScatterStructVector
                (v,&vdata,vcount,sel,ser_count,key_locations,desc,has_null,nulls_first,prefix_len,
                 width,offset);
      break;
    case ARRAY:
      RadixScatterArrayVector
                (v,&vdata,(ulong)nulls_first,sel,ser_count,key_locations,desc,has_null,nulls_first,
                 prefix_len,width,offset);
    }
  }
  else if (PVar1 == VARCHAR) {
    RadixScatterStringVector
              (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,prefix_len,offset);
  }
  else if (PVar1 == UINT128) {
    TemplatedRadixScatter<duckdb::uhugeint_t>
              (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
  }
  else {
    if (PVar1 != INT128) goto switchD_00accf46_caseD_a;
    TemplatedRadixScatter<duckdb::hugeint_t>
              (&vdata,sel,ser_count,key_locations,desc,has_null,nulls_first,offset);
  }
  if (vdata.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (vdata.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void RowOperations::RadixScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                 data_ptr_t *key_locations, bool desc, bool has_null, bool nulls_first,
                                 idx_t prefix_len, idx_t width, idx_t offset) {
#ifdef DEBUG
	// initialize to verify written width later
	auto key_locations_copy = make_uniq_array<data_ptr_t>(ser_count);
	for (idx_t i = 0; i < ser_count; i++) {
		key_locations_copy[i] = key_locations[i];
	}
#endif

	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);
	switch (v.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedRadixScatter<int8_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT16:
		TemplatedRadixScatter<int16_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT32:
		TemplatedRadixScatter<int32_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT64:
		TemplatedRadixScatter<int64_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT8:
		TemplatedRadixScatter<uint8_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT16:
		TemplatedRadixScatter<uint16_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT32:
		TemplatedRadixScatter<uint32_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT64:
		TemplatedRadixScatter<uint64_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT128:
		TemplatedRadixScatter<hugeint_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT128:
		TemplatedRadixScatter<uhugeint_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::FLOAT:
		TemplatedRadixScatter<float>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::DOUBLE:
		TemplatedRadixScatter<double>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INTERVAL:
		TemplatedRadixScatter<interval_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::VARCHAR:
		RadixScatterStringVector(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, prefix_len, offset);
		break;
	case PhysicalType::LIST:
		RadixScatterListVector(v, vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, prefix_len, width,
		                       offset);
		break;
	case PhysicalType::STRUCT:
		RadixScatterStructVector(v, vdata, vcount, sel, ser_count, key_locations, desc, has_null, nulls_first,
		                         prefix_len, width, offset);
		break;
	case PhysicalType::ARRAY:
		RadixScatterArrayVector(v, vdata, vcount, sel, ser_count, key_locations, desc, has_null, nulls_first,
		                        prefix_len, width, offset);
		break;
	default:
		throw NotImplementedException("Cannot ORDER BY column with type %s", v.GetType().ToString());
	}

#ifdef DEBUG
	for (idx_t i = 0; i < ser_count; i++) {
		D_ASSERT(key_locations[i] == key_locations_copy[i] + width);
	}
#endif
}